

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_cursor.cpp
# Opt level: O1

Cursor __thiscall Am_Cursor_Data::Get_X_Cursor(Am_Cursor_Data *this,Am_Drawonable_Impl *draw)

{
  uint *puVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Am_Wrapper *pAVar5;
  Am_Image_Array_Data *this_00;
  Am_Image_Array_Data *this_01;
  Am_Style_Data *this_02;
  Am_Style_Data *this_03;
  Cursor CVar6;
  ostream *poVar7;
  char *pcVar8;
  XColor bg_col;
  XColor fg_col;
  XColor local_50;
  XColor local_40;
  
  bVar3 = Am_Image_Array::Valid(&this->image);
  if (bVar3) {
    pAVar5 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&this->image);
    this_00 = Am_Image_Array_Data::Narrow(pAVar5);
    pAVar5 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&this->mask);
    this_01 = Am_Image_Array_Data::Narrow(pAVar5);
    pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&this->fg_color);
    this_02 = Am_Style_Data::Narrow(pAVar5);
    pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&this->bg_color);
    this_03 = Am_Style_Data::Narrow(pAVar5);
    if ((((this_00 == (Am_Image_Array_Data *)0x0) || (this_01 == (Am_Image_Array_Data *)0x0)) ||
        (this_02 == (Am_Style_Data *)0x0)) || (this_03 == (Am_Style_Data *)0x0)) {
      pcVar8 = "Error in making cursor ";
      goto LAB_00275096;
    }
    local_40 = Am_Style_Data::Get_X_Color(this_02,draw);
    local_50 = Am_Style_Data::Get_X_Color(this_03,draw);
    Am_Image_Array_Data::Get_X_Pixmap(this_00,draw);
    Am_Image_Array_Data::Get_X_Pixmap(this_01,draw);
    if (((this_00->image_ != (Am_Generic_Image *)0x0) && (1 < (this_00->image_->iminfo).depth)) ||
       ((this_01->image_ != (Am_Generic_Image *)0x0 && (1 < (this_01->image_->iminfo).depth)))) {
      Am_Error("** Tried to make a cursor out of a pixmap with depth > 1\n");
    }
    puVar1 = &(this_02->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(this_02->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this_02);
    }
    puVar1 = &(this_03->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(this_03->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this_03);
    }
    iVar2 = this_00->x_hot;
    iVar4 = this_00->y_hot;
    if (iVar4 == -1 || iVar2 == -1) {
      iVar2 = this->x_hot;
      iVar4 = this->y_hot;
    }
    if ((iVar2 == -1) || (iVar4 == -1)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cursor has no hot spot",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
    }
    else {
      CVar6 = XCreatePixmapCursor(draw->screen->display,this_00->main_bitmap,this_01->main_bitmap,
                                  &local_40,&local_50,iVar2,iVar4);
      if (CVar6 == 4) {
        pcVar8 = "Bad Pixmap error in making cursor ";
LAB_00275096:
        poVar7 = std::operator<<((ostream *)&std::cerr,pcVar8);
        std::endl<char,std::char_traits<char>>(poVar7);
        Am_Error();
      }
      if (CVar6 == 0xb) {
        pcVar8 = "Bad Alloc error in making cursor ";
        goto LAB_00275096;
      }
      if (CVar6 == 8) {
        pcVar8 = "Bad Match error in making cursor ";
        goto LAB_00275096;
      }
      this->main_cursor = CVar6;
    }
    puVar1 = &(this_00->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(this_00->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this_00);
    }
    puVar1 = &(this_01->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(this_01->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this_01);
    }
    CVar6 = this->main_cursor;
  }
  else {
    CVar6 = 0;
  }
  return CVar6;
}

Assistant:

Cursor
Am_Cursor_Data::Get_X_Cursor(Am_Drawonable_Impl *draw)
{
  // get the pointers to the images and the colors
  if (!image.Valid()) {
    return 0;
  }

  Am_Image_Array_Data *im = Am_Image_Array_Data::Narrow(image);
  Am_Image_Array_Data *im_mask = Am_Image_Array_Data::Narrow(mask);
  Am_Style_Data *fg_data = Am_Style_Data::Narrow(fg_color);
  Am_Style_Data *bg_data = Am_Style_Data::Narrow(bg_color);

  if (!(im && im_mask && fg_data && bg_data)) {
    std::cerr << "Error in making cursor " << std::endl;
    Am_Error();
    return 0;
  }

  // now actually get the images and the colors
  XColor fg_col = fg_data->Get_X_Color(draw);
  XColor bg_col = bg_data->Get_X_Color(draw);
  im->Get_X_Pixmap(draw);
  im_mask->Get_X_Pixmap(draw);
  if ((im->Get_Depth() > 1) || (im_mask->Get_Depth() > 1))
    Am_Error("** Tried to make a cursor out of a pixmap with depth > 1\n");

  if (fg_data)
    fg_data->Release();
  if (bg_data)
    bg_data->Release();

  // get the hot spot
  int used_x_hot, used_y_hot;
  im->Get_Hot_Spot(used_x_hot, used_y_hot);

  if ((used_x_hot == -1) || (used_y_hot == -1)) {
    used_x_hot = x_hot;
    used_y_hot = y_hot;
  }

  if ((used_x_hot == -1) || (used_y_hot == -1)) {
    std::cerr << "Cursor has no hot spot" << std::endl;
  } else {
    // make a cursor
    Cursor cursor = XCreatePixmapCursor(draw->screen->display, im->main_bitmap,
                                        im_mask->main_bitmap, &fg_col, &bg_col,
                                        used_x_hot, used_y_hot);
    if (cursor == BadMatch) {
      std::cerr << "Bad Match error in making cursor " << std::endl;
      Am_Error();
    } else if (cursor == BadAlloc) {
      std::cerr << "Bad Alloc error in making cursor " << std::endl;
      Am_Error();
    } else if (cursor == BadPixmap) {
      std::cerr << "Bad Pixmap error in making cursor " << std::endl;
      Am_Error();
    }
    main_cursor = cursor;
  }

  if (im)
    im->Release();
  if (im_mask)
    im_mask->Release();

  return main_cursor;
}